

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void __thiscall RangeLock_MoveAssign_Test::TestBody(RangeLock_MoveAssign_Test *this)

{
  bool bVar1;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *pMVar2;
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *pTVar3;
  MockSpec<void_(unsigned_long,_unsigned_long)> *pMVar4;
  TypedExpectation<void_(unsigned_long,_unsigned_long)> *pTVar5;
  file_base *rhs;
  Message *pMVar6;
  char *pcVar7;
  Matcher<pstore::file::file_base::blocking_mode> *gmock_a3;
  string local_d08;
  AssertHelper local_ce8;
  Message local_ce0;
  bool local_cd1;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar__1;
  Message local_cb8;
  lock_kind local_cb0 [2];
  undefined1 local_ca8 [8];
  AssertionResult gtest_ar_4;
  Message local_c90;
  size_t local_c88;
  unsigned_long local_c80;
  undefined1 local_c78 [8];
  AssertionResult gtest_ar_3;
  Message local_c60;
  uint64_t local_c58;
  unsigned_long local_c50;
  undefined1 local_c48 [8];
  AssertionResult gtest_ar_2;
  Message local_c30;
  file_base *local_c28;
  mock_file *local_c20;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_be8;
  Message local_be0;
  bool local_bd1;
  undefined1 local_bd0 [8];
  AssertionResult gtest_ar_;
  Message local_bb8;
  undefined1 local_bb0 [8];
  AssertionResult gtest_ar;
  range_lock target_lock;
  range_lock source_lock;
  ExpectationSet local_b30;
  WithoutMatchers local_af9;
  Matcher<unsigned_long> local_af8;
  Matcher<unsigned_long> local_ae0;
  MockSpec<void_(unsigned_long,_unsigned_long)> local_ac8;
  undefined1 local_a90 [8];
  Expectation file1_unlock;
  WithoutMatchers local_a49;
  Matcher<unsigned_long> local_a48;
  Matcher<unsigned_long> local_a30;
  MockSpec<void_(unsigned_long,_unsigned_long)> local_a18;
  undefined1 local_9e0 [8];
  Expectation file2_unlock;
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_9c0;
  ExpectationSet local_9a0;
  WithoutMatchers local_969;
  Matcher<pstore::file::file_base::blocking_mode> local_968;
  Matcher<pstore::file::file_base::lock_kind> local_950;
  Matcher<unsigned_long> local_938;
  Matcher<unsigned_long> local_920;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_908;
  undefined1 local_8a0 [8];
  Expectation file2_lock;
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_880;
  WithoutMatchers local_859;
  Matcher<pstore::file::file_base::blocking_mode> local_858;
  Matcher<pstore::file::file_base::lock_kind> local_840;
  Matcher<unsigned_long> local_828;
  Matcher<unsigned_long> local_810;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_7f8;
  undefined1 local_790 [8];
  Expectation file1_lock;
  undefined1 local_770 [8];
  mock_file file2;
  mock_file file1;
  RangeLock_MoveAssign_Test *this_local;
  
  anon_unknown.dwarf_16883::mock_file::mock_file
            ((mock_file *)
             ((long)&file2.gmock02_unlock_96.super_UntypedFunctionMockerBase.untyped_expectations_.
                     super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                     ._M_impl.super__Vector_impl_data + 0x10));
  anon_unknown.dwarf_16883::mock_file::mock_file((mock_file *)local_770);
  testing::Matcher<unsigned_long>::Matcher(&local_810,0xd);
  testing::Matcher<unsigned_long>::Matcher(&local_828,0x11);
  testing::Matcher<pstore::file::file_base::lock_kind>::Matcher(&local_840,exclusive_write);
  testing::Matcher<pstore::file::file_base::blocking_mode>::Matcher(&local_858,blocking);
  anon_unknown.dwarf_16883::mock_file::gmock_lock
            (&local_7f8,
             (mock_file *)
             ((long)&file2.gmock02_unlock_96.super_UntypedFunctionMockerBase.untyped_expectations_.
                     super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                     ._M_impl.super__Vector_impl_data + 0x10),&local_810,&local_828,&local_840,
             &local_858);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::operator()(&local_7f8,&local_859,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xb7,"file1",
                      "lock (13UL, std::size_t{17}, mock_file::lock_kind::exclusive_write, mock_file::blocking_mode::blocking)"
                     );
  testing::Return<bool>
            ((testing *)
             &file2_lock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_880,
             (ReturnAction *)
             &file2_lock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pTVar3 = testing::internal::
           TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::WillOnce(pTVar3,&local_880);
  testing::Expectation::Expectation((Expectation *)local_790,&pTVar3->super_ExpectationBase);
  testing::
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~Action(&local_880);
  testing::internal::ReturnAction<bool>::~ReturnAction
            ((ReturnAction<bool> *)
             &file2_lock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~MockSpec(&local_7f8);
  testing::Matcher<pstore::file::file_base::blocking_mode>::~Matcher(&local_858);
  testing::Matcher<pstore::file::file_base::lock_kind>::~Matcher(&local_840);
  testing::Matcher<unsigned_long>::~Matcher(&local_828);
  testing::Matcher<unsigned_long>::~Matcher(&local_810);
  testing::Matcher<unsigned_long>::Matcher(&local_920,0x13);
  testing::Matcher<unsigned_long>::Matcher(&local_938,0x17);
  testing::Matcher<pstore::file::file_base::lock_kind>::Matcher(&local_950,shared_read);
  testing::Matcher<pstore::file::file_base::blocking_mode>::Matcher(&local_968,blocking);
  gmock_a3 = &local_968;
  anon_unknown.dwarf_16883::mock_file::gmock_lock
            (&local_908,(mock_file *)local_770,&local_920,&local_938,&local_950,gmock_a3);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::
           MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::operator()(&local_908,&local_969,(void *)0x0);
  pTVar3 = testing::internal::
           MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xbd,"file2",
                      "lock (19UL, std::size_t{23}, mock_file::lock_kind::shared_read, mock_file::blocking_mode::blocking)"
                     );
  testing::ExpectationSet::ExpectationSet(&local_9a0,(Expectation *)local_790);
  pTVar3 = testing::internal::
           TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::After(pTVar3,&local_9a0);
  testing::Return<bool>
            ((testing *)
             &file2_unlock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_9c0,
             (ReturnAction *)
             &file2_unlock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pTVar3 = testing::internal::
           TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::WillOnce(pTVar3,&local_9c0);
  testing::Expectation::Expectation((Expectation *)local_8a0,&pTVar3->super_ExpectationBase);
  testing::
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~Action(&local_9c0);
  testing::internal::ReturnAction<bool>::~ReturnAction
            ((ReturnAction<bool> *)
             &file2_unlock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::ExpectationSet::~ExpectationSet(&local_9a0);
  testing::internal::
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~MockSpec(&local_908);
  testing::Matcher<pstore::file::file_base::blocking_mode>::~Matcher(&local_968);
  testing::Matcher<pstore::file::file_base::lock_kind>::~Matcher(&local_950);
  testing::Matcher<unsigned_long>::~Matcher(&local_938);
  testing::Matcher<unsigned_long>::~Matcher(&local_920);
  testing::Matcher<unsigned_long>::Matcher(&local_a30,0x13);
  testing::Matcher<unsigned_long>::Matcher(&local_a48,0x17);
  anon_unknown.dwarf_16883::mock_file::gmock_unlock
            (&local_a18,(mock_file *)local_770,&local_a30,&local_a48);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::operator()
                     (&local_a18,&local_a49,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xc2,"file2","unlock (19UL, std::size_t{23})");
  testing::ExpectationSet::ExpectationSet
            ((ExpectationSet *)
             &file1_unlock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Expectation *)local_8a0);
  pTVar5 = testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::After
                     (pTVar5,(ExpectationSet *)
                             &file1_unlock.expectation_base_.
                              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
  testing::Expectation::Expectation((Expectation *)local_9e0,&pTVar5->super_ExpectationBase);
  testing::ExpectationSet::~ExpectationSet
            ((ExpectationSet *)
             &file1_unlock.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::~MockSpec(&local_a18);
  testing::Matcher<unsigned_long>::~Matcher(&local_a48);
  testing::Matcher<unsigned_long>::~Matcher(&local_a30);
  testing::Matcher<unsigned_long>::Matcher(&local_ae0,0xd);
  testing::Matcher<unsigned_long>::Matcher(&local_af8,0x11);
  anon_unknown.dwarf_16883::mock_file::gmock_unlock
            (&local_ac8,
             (mock_file *)
             ((long)&file2.gmock02_unlock_96.super_UntypedFunctionMockerBase.untyped_expectations_.
                     super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                     ._M_impl.super__Vector_impl_data + 0x10),&local_ae0,&local_af8);
  testing::internal::GetWithoutMatchers();
  pMVar4 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::operator()
                     (&local_ac8,&local_af9,(void *)0x0);
  pTVar5 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xc4,"file1","unlock (13UL, std::size_t{17})");
  pTVar5 = testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::Times(pTVar5,1)
  ;
  testing::ExpectationSet::ExpectationSet(&local_b30,(Expectation *)local_790);
  testing::ExpectationSet::ExpectationSet
            ((ExpectationSet *)&source_lock.kind_,(Expectation *)local_9e0);
  pTVar5 = testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::After
                     (pTVar5,&local_b30,(ExpectationSet *)&source_lock.kind_);
  testing::Expectation::Expectation((Expectation *)local_a90,&pTVar5->super_ExpectationBase);
  testing::ExpectationSet::~ExpectationSet((ExpectationSet *)&source_lock.kind_);
  testing::ExpectationSet::~ExpectationSet(&local_b30);
  testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::~MockSpec(&local_ac8);
  testing::Matcher<unsigned_long>::~Matcher(&local_af8);
  testing::Matcher<unsigned_long>::~Matcher(&local_ae0);
  pstore::file::range_lock::range_lock
            ((range_lock *)&target_lock.kind_,
             (file_base *)
             ((long)&file2.gmock02_unlock_96.super_UntypedFunctionMockerBase.untyped_expectations_.
                     super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                     ._M_impl.super__Vector_impl_data + 0x10),0xd,0x11,exclusive_write);
  pstore::file::range_lock::range_lock
            ((range_lock *)&gtest_ar.message_,(file_base *)local_770,0x13,0x17,shared_read);
  pstore::file::range_lock::lock((range_lock *)&target_lock.kind_);
  pstore::file::range_lock::lock((range_lock *)&gtest_ar.message_);
  pstore::file::range_lock::operator=
            ((range_lock *)&gtest_ar.message_,(range_lock *)&target_lock.kind_);
  rhs = pstore::file::range_lock::file((range_lock *)&target_lock.kind_);
  testing::internal::EqHelper::Compare<pstore::file::file_base>
            ((EqHelper *)local_bb0,"nullptr","source_lock.file ()",(nullptr_t)0x0,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb0);
  if (!bVar1) {
    testing::Message::Message(&local_bb8);
    pMVar6 = testing::Message::operator<<
                       (&local_bb8,
                        (char (*) [72])
                        "The file associated with the source of a move assignment should be null");
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_bb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xdc,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,pMVar6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_bb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb0);
  local_bd1 = pstore::file::range_lock::is_locked((range_lock *)&target_lock.kind_);
  local_bd1 = !local_bd1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bd0,&local_bd1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd0);
  if (!bVar1) {
    testing::Message::Message(&local_be0);
    pMVar6 = testing::Message::operator<<
                       (&local_be0,
                        (char (*) [53])"The source of a move assignment should not be locked");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_bd0,
               (AssertionResult *)"source_lock.is_locked ()","true","false",(char *)gmock_a3);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_be8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xde,pcVar7);
    testing::internal::AssertHelper::operator=(&local_be8,pMVar6);
    testing::internal::AssertHelper::~AssertHelper(&local_be8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd0);
  local_c20 = (mock_file *)
              ((long)&file2.gmock02_unlock_96.super_UntypedFunctionMockerBase.untyped_expectations_.
                      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                      ._M_impl.super__Vector_impl_data + 0x10);
  local_c28 = pstore::file::range_lock::file((range_lock *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<(anonymous_namespace)::mock_file_*,_pstore::file::file_base_*,_nullptr>
            ((EqHelper *)local_c18,"&file1","target_lock.file ()",&local_c20,&local_c28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar1) {
    testing::Message::Message(&local_c30);
    pMVar6 = testing::Message::operator<<
                       (&local_c30,
                        (char (*) [57])"The file associated with the target of the move is wrong");
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_c18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xe3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  local_c50 = 0xd;
  local_c58 = pstore::file::range_lock::offset((range_lock *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_c48,"13UL","target_lock.offset ()",&local_c50,&local_c58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    testing::Message::Message(&local_c60);
    pMVar6 = testing::Message::operator<<
                       (&local_c60,
                        (char (*) [50])"The offset of the move target range_lock is wrong");
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_c48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xe5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  local_c80 = 0x11;
  local_c88 = pstore::file::range_lock::size((range_lock *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_c78,"std::size_t{17}","target_lock.size ()",&local_c80,&local_c88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c78);
  if (!bVar1) {
    testing::Message::Message(&local_c90);
    pMVar6 = testing::Message::operator<<
                       (&local_c90,(char (*) [48])"The size of the move target range_lock is wrong")
    ;
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_c78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xe7,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,pMVar6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_c90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c78);
  local_cb0[1] = 1;
  local_cb0[0] = pstore::file::range_lock::kind((range_lock *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<pstore::file::file_base::lock_kind,_pstore::file::file_base::lock_kind,_nullptr>
            ((EqHelper *)local_ca8,"mock_file::lock_kind::exclusive_write","target_lock.kind ()",
             local_cb0 + 1,local_cb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ca8);
  if (!bVar1) {
    testing::Message::Message(&local_cb8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_ca8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xe9,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_cb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_cb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ca8);
  local_cd1 = pstore::file::range_lock::is_locked((range_lock *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cd0,&local_cd1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd0);
  if (!bVar1) {
    testing::Message::Message(&local_ce0);
    pMVar6 = testing::Message::operator<<
                       (&local_ce0,
                        (char (*) [55])"Expected the target of the move operation to be locked");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d08,(internal *)local_cd0,(AssertionResult *)"target_lock.is_locked ()",
               "false","true",(char *)gmock_a3);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ce8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xea,pcVar7);
    testing::internal::AssertHelper::operator=(&local_ce8,pMVar6);
    testing::internal::AssertHelper::~AssertHelper(&local_ce8);
    std::__cxx11::string::~string((string *)&local_d08);
    testing::Message::~Message(&local_ce0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
  pstore::file::range_lock::unlock((range_lock *)&gtest_ar.message_);
  pstore::file::range_lock::~range_lock((range_lock *)&gtest_ar.message_);
  pstore::file::range_lock::~range_lock((range_lock *)&target_lock.kind_);
  testing::Expectation::~Expectation((Expectation *)local_a90);
  testing::Expectation::~Expectation((Expectation *)local_9e0);
  testing::Expectation::~Expectation((Expectation *)local_8a0);
  testing::Expectation::~Expectation((Expectation *)local_790);
  anon_unknown.dwarf_16883::mock_file::~mock_file((mock_file *)local_770);
  anon_unknown.dwarf_16883::mock_file::~mock_file
            ((mock_file *)
             ((long)&file2.gmock02_unlock_96.super_UntypedFunctionMockerBase.untyped_expectations_.
                     super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                     ._M_impl.super__Vector_impl_data + 0x10));
  return;
}

Assistant:

TEST (RangeLock, MoveAssign) {
    mock_file file1;
    mock_file file2;

    using ::testing::_;
    using ::testing::Expectation;
    using ::testing::Return;

    Expectation file1_lock = EXPECT_CALL (file1, lock (UINT64_C (13),   // offset
                                                       std::size_t{17}, // size
                                                       mock_file::lock_kind::exclusive_write,
                                                       mock_file::blocking_mode::blocking))
                                 .WillOnce (Return (true));

    Expectation file2_lock = EXPECT_CALL (file2, lock (UINT64_C (19),   // offset
                                                       std::size_t{23}, // size
                                                       mock_file::lock_kind::shared_read,
                                                       mock_file::blocking_mode::blocking))
                                 .After (file1_lock)
                                 .WillOnce (Return (true));

    Expectation file2_unlock =
        EXPECT_CALL (file2, unlock (UINT64_C (19), std::size_t{23})).After (file2_lock);

    Expectation file1_unlock = EXPECT_CALL (file1, unlock (UINT64_C (13), std::size_t{17}))
                                   .Times (1)
                                   .After (file1_lock, file2_unlock);



    pstore::file::range_lock source_lock (&file1,
                                          UINT64_C (13),   // offset
                                          std::size_t{17}, // size
                                          mock_file::lock_kind::exclusive_write);
    pstore::file::range_lock target_lock (&file2,
                                          UINT64_C (19),   // offset
                                          std::size_t{23}, // size
                                          mock_file::lock_kind::shared_read);

    // Lock both the source and target of the assignment, just to be tricky.
    source_lock.lock ();
    target_lock.lock ();
    target_lock = std::move (source_lock);

// Clang SA (correctly) warns that this is (strictly) undefined behavior. However, the
// moved-from type is defined here and so is its behaviour that I would like to test.
#ifndef __clang_analyzer__
    // Check that lock1 was "destroyed" by the move
    EXPECT_EQ (nullptr, source_lock.file ())
        << "The file associated with the source of a move assignment should be null";
    EXPECT_FALSE (source_lock.is_locked ())
        << "The source of a move assignment should not be locked";
#endif

    // Check that lock2 matches the state of lock1 before the move
    EXPECT_EQ (&file1, target_lock.file ())
        << "The file associated with the target of the move is wrong";
    EXPECT_EQ (UINT64_C (13), target_lock.offset ())
        << "The offset of the move target range_lock is wrong";
    EXPECT_EQ (std::size_t{17}, target_lock.size ())
        << "The size of the move target range_lock is wrong";
    EXPECT_EQ (mock_file::lock_kind::exclusive_write, target_lock.kind ());
    EXPECT_TRUE (target_lock.is_locked ())
        << "Expected the target of the move operation to be locked";

    target_lock.unlock ();
}